

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::tableJust(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  bool bVar1;
  uint uVar2;
  int el;
  RefAST RVar3;
  NoViableAltException *pNVar4;
  RefCount<AST> *this_02;
  RefAST tmp48_AST;
  RefAST tmp50_AST;
  RefAST tmp49_AST;
  RefAST tableJust_AST;
  ASTPair currentAST;
  RefAST tmp47_AST;
  undefined1 local_b8 [16];
  ASTFactory local_a8;
  ASTPair local_98;
  RefCount<Token> local_88;
  ASTFactory local_80;
  RefCount<Token> local_70;
  RefCount<Token> local_68;
  RefCount<AST> local_60;
  RefAST local_58;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a8.nodeFactory = (factory_type)nullAST;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_a8.nodeFactory = (factory_type)0x0;
  }
  else {
    uVar2 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar2 + 1;
    ((Ref *)local_a8.nodeFactory)->count = uVar2 + 2;
  }
  local_60.ref = (Ref *)local_a8.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)local_b8,(RefToken *)this_01);
  RefCount<AST>::operator=(&local_60,(RefCount<AST> *)local_b8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_b8);
  RefCount<Token>::~RefCount(&local_68);
  Parser::match((Parser *)this,6);
  local_b8._0_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_b8._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  ASTFactory::create(&local_a8,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)local_b8,(RefCount<AST> *)&local_a8);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
  RefCount<Token>::~RefCount(&local_70);
  if ((Ref *)local_b8._0_8_ == (Ref *)0x0) {
    local_38.ref = (Ref *)0x0;
  }
  else {
    *(uint *)(local_b8._0_8_ + 8) = *(uint *)(local_b8._0_8_ + 8) + 1;
    local_38.ref = (Ref *)local_b8._0_8_;
  }
  ASTFactory::addASTChild(this_01,&local_98,&local_38);
  RefCount<AST>::~RefCount(&local_38);
  Parser::match((Parser *)this,0x38);
  local_a8._vptr_ASTFactory = (_func_int **)nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_a8._vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)(local_b8 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)&local_a8,(RefCount<AST> *)(local_b8 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_b8 + 8));
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_80.nodeFactory);
  Parser::match((Parser *)this,7);
  uVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (uVar2 < 0x36) {
    if ((0x2d0140fc00e340U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((ulong)uVar2 != 0xb) goto LAB_0018c8c7;
      directives(this);
      local_40.ref = this_00->ref;
      if (local_40.ref == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_01,&local_98,&local_40);
      RefCount<AST>::~RefCount(&local_40);
    }
    uVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar3 = nullAST;
    if (uVar2 < 0x36) {
      if ((0x2d0140fc00e240U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_0018ca4b;
      if ((ulong)uVar2 == 8) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar3.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_b8._8_8_ = RVar3.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
        ASTFactory::create(&local_80,(RefToken *)this_01);
        RefCount<AST>::operator=((RefCount<AST> *)(local_b8 + 8),(RefCount<AST> *)&local_80);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_80);
        RefCount<Token>::~RefCount(&local_88);
        Parser::match((Parser *)this,8);
        this_02 = (RefCount<AST> *)(local_b8 + 8);
        while( true ) {
          RefCount<AST>::~RefCount(this_02);
LAB_0018ca4b:
          el = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          bVar1 = BitSet::member(&_tokenSet_12,el);
          if (!bVar1) break;
          subEntry(this);
          local_58.ref = this_00->ref;
          if (local_58.ref == (Ref *)0x0) {
            local_58.ref = (Ref *)0x0;
          }
          else {
            (local_58.ref)->count = (local_58.ref)->count + 1;
          }
          ASTFactory::addASTChild(this_01,&local_98,&local_58);
          this_02 = &local_58;
        }
        RefCount<AST>::operator=((RefCount<AST> *)&local_a8.nodeFactory,&local_98.root);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_b8);
        RefCount<AST>::~RefCount(&local_60);
        RefCount<AST>::operator=(this_00,(RefCount<AST> *)&local_a8.nodeFactory);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_a8.nodeFactory);
        RefCount<AST>::~RefCount(&local_98.child);
        RefCount<AST>::~RefCount(&local_98.root);
        return;
      }
    }
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_50);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
LAB_0018c8c7:
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_48);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableJust() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableJust_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp47_AST = nullAST;
		tmp47_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp48_AST = nullAST;
		tmp48_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp48_AST);
		match(LITERAL_justification);
		RefAST tmp49_AST = nullAST;
		tmp49_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp50_AST = nullAST;
			tmp50_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_LPAREN:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LITERAL_pseudo:
		case LIT_UHEX:
		case LITERAL_codepoint:
		case LITERAL_glyphid:
		case LITERAL_postscript:
		case LITERAL_unicode:
		case LITERAL_pass:
		case LITERAL_if:
		case OP_LBRACKET:
		case OP_UNDER:
		case OP_AT:
		case OP_HASH:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			if ((_tokenSet_12.member(LA(1)))) {
				subEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop269;
			}
			
		} while (true);
		_loop269:;
		}
		tableJust_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableJust_AST;
}